

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq_word_validation_test.c
# Opt level: O3

_Bool accept_rec(automaton *a,char *word,char *state_list)

{
  char cVar1;
  _Bool _Var2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  char (*__s) [101];
  uint uVar6;
  bool bVar7;
  char local_428 [8];
  char state_list_extended [1000];
  
  sVar3 = strlen(word);
  sVar4 = strlen(state_list);
  state_list_extended._992_8_ = state_list;
  if (sVar3 <= sVar4 - 1) {
    _Var2 = is_acceptable(a,state_list[sVar4 - 1]);
    return _Var2;
  }
  cVar1 = state_list[sVar4 - 1] + -1;
  __s = a->transitions + (long)(char)(word[sVar4 - 1] + -0x61) + a->alphabet_size * (long)cVar1;
  sVar3 = strlen(*__s);
  uVar6 = (uint)sVar3;
  if ((int)cVar1 < (int)a->universal_states_size) {
    if ((int)uVar6 < 1) {
      _Var2 = true;
    }
    else {
      lVar5 = 0;
      do {
        strcpy(local_428,(char *)state_list_extended._992_8_);
        sVar3 = strlen(local_428);
        local_428[sVar3] = (*__s)[lVar5];
        local_428[sVar3 + 1] = '\0';
        _Var2 = accept_rec(a,word,local_428);
        if (!_Var2) {
          return _Var2;
        }
        bVar7 = (ulong)(uVar6 & 0x7fffffff) - 1 != lVar5;
        lVar5 = lVar5 + 1;
      } while (bVar7);
    }
  }
  else if ((int)uVar6 < 1) {
    _Var2 = false;
  }
  else {
    lVar5 = 0;
    do {
      strcpy(local_428,(char *)state_list_extended._992_8_);
      sVar3 = strlen(local_428);
      local_428[sVar3] = (*__s)[lVar5];
      local_428[sVar3 + 1] = '\0';
      _Var2 = accept_rec(a,word,local_428);
      if (_Var2) {
        return _Var2;
      }
      bVar7 = (ulong)(uVar6 & 0x7fffffff) - 1 != lVar5;
      lVar5 = lVar5 + 1;
    } while (bVar7);
  }
  return _Var2;
}

Assistant:

bool accept_rec(const automaton *a, const char *word, const char *state_list) {
    size_t w_len = strlen(word);
    size_t depth = strlen(state_list)-1;

    if(depth >= w_len) {
        return is_acceptable(a, state_list[depth]);
    }
    const char * following_states = get_following_states(a, state_list[depth], word[depth]);
    size_t following_states_length = strlen(following_states);
    if(is_existential(a, state_list[depth])) {
        // need to accept_rec any of following states
        int i;
        for(i=0; i<(int)following_states_length; i++) {
            char state_list_extended[WORD_LEN_MAX]; // states list for given word is equal its length
            strcpy(state_list_extended, state_list);
            size_t fs_len = strlen(state_list_extended);
            // append one of possible following states to current state_list
            state_list_extended[fs_len] = following_states[i];
            state_list_extended[fs_len+1] = '\0';
            assert(strlen(state_list_extended) == strlen(state_list)+1);

            if(accept_rec(a, word, state_list_extended)) {
                return true;
            }
        }
        assert(i == following_states_length);
        return false; // no state_list was accepted
    }
    assert(is_universal(a, state_list[depth]));
    int i;
    for(i=0; i<(int)following_states_length; i++) {
        char state_list_extended[WORD_LEN_MAX]; // states list for given word is equal its length
        strcpy(state_list_extended, state_list);
        size_t fs_len = strlen(state_list_extended);
        // append one of possible following states to current state_list
        state_list_extended[fs_len] = following_states[i];
        state_list_extended[fs_len+1] = '\0';
        assert(strlen(state_list_extended) == strlen(state_list)+1);

        if(!accept_rec(a, word, state_list_extended)) {
            return false;
        }
    }
    assert(i == following_states_length);
    return true; // all states were accepted
}